

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<double,_2,_2> *
tcu::operator*(Matrix<double,_2,_2> *__return_storage_ptr__,Matrix<double,_2,_2> *a,
              Matrix<double,_2,_2> *b)

{
  double dVar1;
  long lVar2;
  long lVar3;
  Matrix<double,_2,_2> *res;
  double *pdVar4;
  Vector<double,_2> *pVVar5;
  long lVar6;
  bool bVar7;
  double v;
  undefined8 uVar8;
  
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  pdVar4 = (double *)__return_storage_ptr__;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3ff0000000000000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(undefined8 *)((long)pdVar4 + lVar6) = uVar8;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 == 0x10);
    pdVar4 = pdVar4 + 1;
    lVar2 = lVar2 + 0x10;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  lVar3 = 0;
  do {
    pVVar5 = (Vector<double,_2> *)b;
    lVar2 = 0;
    do {
      dVar1 = 0.0;
      lVar6 = 0;
      do {
        dVar1 = dVar1 + *(double *)((long)a + lVar6 * 2) *
                        *(double *)
                         ((long)((Vector<tcu::Vector<double,_2>,_2> *)pVVar5->m_data)->m_data[0].
                                m_data + lVar6);
        lVar6 = lVar6 + 8;
      } while (lVar6 == 8);
      (__return_storage_ptr__->m_data).m_data[lVar2].m_data[lVar3] = dVar1;
      pVVar5 = pVVar5 + 1;
      bVar7 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar7);
    a = (Matrix<double,_2,_2> *)((long)a + 8);
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}